

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer __result;
  bool bVar1;
  ostream *poVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  vector<double,_std::allocator<double>_> filtered;
  vector<double,_std::allocator<double>_> test;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  vector<double,_std::allocator<double>_> expectedFilter;
  function<bool_(double)> func;
  
  local_68 = 0x4000000000000000;
  uStack_60 = 0x4002666666666666;
  local_78._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_78._8_8_ = 0x3ff3333333333333;
  local_58 = 0x4008000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector(&test,__l,(allocator_type *)&func);
  func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  func.super__Function_base._M_functor._8_8_ = 0;
  func._M_invoker =
       std::
       _Function_handler<bool_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp:13:34)>
       ::_M_invoke;
  func.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp:13:34)>
       ::_M_manager;
  local_78._M_unused._M_member_pointer = 0x3ff0000000000000;
  local_78._8_8_ = 0x3ff3333333333333;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector
            (&expectedFilter,__l_00,(allocator_type *)&filtered);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test filter...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::vector<double,_std::allocator<double>_>::vector
            (&filtered,
             (long)test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)local_78._M_pod_data);
  __result = filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  std::function<bool_(double)>::function((function<bool_(double)> *)&local_78,&func);
  _Var3 = std::
          copy_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::function<bool(double)>>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )test.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     __result,(function<bool_(double)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::vector<double,_std::allocator<double>_>::resize
            (&filtered,
             (long)_Var3._M_current -
             (long)filtered.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  bVar1 = std::operator==(&expectedFilter,&filtered);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&filtered.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&expectedFilter.super__Vector_base<double,_std::allocator<double>_>);
    std::_Function_base::~_Function_base(&func.super__Function_base);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&test.super__Vector_base<double,_std::allocator<double>_>);
    return 0;
  }
  __assert_fail("expectedFilter==filtered",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/filter/main.cpp"
                ,0x11,"int main()");
}

Assistant:

int main(){

  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< bool(double) > func= [] (const double & element){return element<2.0;};
  vector<double> expectedFilter={ 1.0, 1.2};
  cout << "Test filter..." << endl;
  auto filtered = Functional::filter(test,func); 
  assert( expectedFilter==filtered);
  cout << "passed!" << endl;
  
  return 0;

}